

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_passphrase.c
# Opt level: O0

int archive_write_set_passphrase(archive *_a,char *p)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  int magic_test;
  archive_write *a;
  char *p_local;
  archive *_a_local;
  
  iVar2 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_set_passphrase");
  if (iVar2 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else if ((p == (char *)0x0) || (*p == '\0')) {
    archive_set_error(_a,-1,"Empty passphrase is unacceptable");
    _a_local._4_4_ = -0x19;
  }
  else {
    free(*(void **)&_a[2].file_count);
    pcVar3 = strdup(p);
    *(char **)&_a[2].file_count = pcVar3;
    lVar1._0_4_ = _a[2].file_count;
    lVar1._4_4_ = _a[2].archive_error_number;
    if (lVar1 == 0) {
      archive_set_error(_a,0xc,"Can\'t allocate data for passphrase");
      _a_local._4_4_ = -0x1e;
    }
    else {
      _a_local._4_4_ = 0;
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_write_set_passphrase(struct archive *_a, const char *p)
{
	struct archive_write *a = (struct archive_write *)_a;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC, ARCHIVE_STATE_NEW,
		"archive_write_set_passphrase");

	if (p == NULL || p[0] == '\0') {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Empty passphrase is unacceptable");
		return (ARCHIVE_FAILED);
	}
	free(a->passphrase);
	a->passphrase = strdup(p);
	if (a->passphrase == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate data for passphrase");
		return (ARCHIVE_FATAL);
	}
	return (ARCHIVE_OK);
}